

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  type_conflict5 tVar1;
  element_type *peVar2;
  long in_RDI;
  double in_stack_00000050;
  cpp_dec_float<200U,_int,_void> *in_stack_00000058;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff38;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff40;
  undefined1 local_88 [16];
  Real local_78 [5];
  Real local_50;
  long local_30;
  long local_20;
  Real *local_18;
  Real *local_8;
  
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_ffffffffffffff38);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x789632);
  local_50 = Tolerances::epsilon(peVar2);
  tVar1 = boost::multiprecision::operator<=
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffff38,(double *)0x78965d);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78966d);
  if (tVar1) {
    in_stack_ffffffffffffff40 = (cpp_dec_float<200U,_int,_void> *)local_88;
    SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffff38);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x789698);
    local_78[0] = Tolerances::epsilon(peVar2);
    local_18 = local_78;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_00000058,in_stack_00000050);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x789705);
  }
  local_20 = in_RDI + 0x1c;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_ffffffffffffff40,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff38);
  local_30 = in_RDI + 0x1b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_ffffffffffffff40,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff38);
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         newDelta = this->tolerances()->epsilon();

      this->delta = newDelta;
      fastDelta = newDelta;
   }